

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

int read_header(archive_read *a,archive_entry *entry)

{
  byte *__src;
  char *pcVar1;
  byte bVar2;
  mtree *mtree;
  __mode_t p;
  uint uVar3;
  int iVar4;
  uint uVar5;
  mode_t mVar6;
  int *piVar7;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar8;
  archive_string *paVar9;
  ulong uVar10;
  size_t sVar11;
  size_t len;
  int64_t iVar12;
  mtree_entry *pmVar13;
  char *pcVar14;
  size_t sVar15;
  char cVar16;
  char *pcVar17;
  mtree_entry *pmVar18;
  byte *pbVar19;
  long lVar20;
  mtree_entry *pmVar21;
  char *pcVar22;
  byte *__dest;
  long lVar23;
  mtree_entry *pmVar24;
  long lVar25;
  undefined1 *puVar26;
  char *pcVar27;
  archive_entry *entry_00;
  mtree_option *global;
  archive_entry *sparse_entry;
  stat st_storage;
  long local_108;
  archive_entry *local_100;
  uint local_f4;
  mtree_entry *local_f0;
  mtree_entry *local_e8;
  archive_entry *local_e0;
  mtree_entry *local_d8;
  archive_entry *local_d0;
  mtree_entry *local_c8;
  stat local_c0;
  
  mtree = (mtree *)a->format->data;
  if (-1 < mtree->fd) {
    close(mtree->fd);
    mtree->fd = -1;
  }
  local_e0 = entry;
  if (mtree->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    mtree->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      pcVar17 = (char *)0xffffffe2;
      goto LAB_00136711;
    }
    archive_entry_linkresolver_set_strategy(res,0x80000);
    mtree->archive_format = 0x80000;
    mtree->archive_format_name = "mtree";
    local_100 = (archive_entry *)0x0;
    detect_form(a,(int *)&local_d0);
    local_108 = 1;
    __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
    if (__s != (void *)0x0) {
      local_c8 = (mtree_entry *)&mtree->entries;
      local_f0 = (mtree_entry *)0x0;
LAB_00135f2b:
      lVar23 = 0;
      pcVar14 = (char *)0x0;
LAB_00135f31:
      pmVar18 = (mtree_entry *)local_c0.st_dev;
      if (-1 < (long)local_c0.st_dev) {
        pvVar8 = memchr(__s,10,local_c0.st_dev);
        if (pvVar8 != (void *)0x0) {
          pmVar18 = (mtree_entry *)((long)pvVar8 + (1 - (long)__s));
          local_c0.st_dev = (__dev_t)pmVar18;
        }
        if ((long)(pcVar14 + (long)&pmVar18->next) < 0x10000) {
          paVar9 = archive_string_ensure
                             ((archive_string *)mtree,(size_t)(pcVar14 + (long)&pmVar18->next + 1));
          if (paVar9 != (archive_string *)0x0) {
            memcpy((mtree->line).s + (long)pcVar14,__s,local_c0.st_dev);
            __archive_read_consume(a,local_c0.st_dev);
            pcVar17 = pcVar14 + (long)(mtree_entry **)local_c0.st_dev;
            (mtree->line).s[(long)pcVar17] = '\0';
            pcVar27 = (mtree->line).s;
            __dest = (byte *)(pcVar27 + lVar23);
            do {
              bVar2 = *__dest;
              pbVar19 = __dest;
              if (bVar2 < 0x5c) {
                if (bVar2 == 0) goto LAB_0013600c;
                if (bVar2 != 10) {
                  if (bVar2 != 0x23) goto LAB_00135fff;
                  if (pvVar8 == (void *)0x0) goto LAB_0013600c;
                }
                if (pcVar17 == (char *)0x0) goto LAB_00136543;
                if (-1 < (long)pcVar17) {
                  lVar25 = -(long)pcVar14;
                  pcVar17 = pcVar14 + 1;
                  lVar23 = 0;
                  goto LAB_00136081;
                }
                free_options((mtree_option *)local_100);
                if ((int)pcVar17 != 0) goto LAB_00136711;
                goto LAB_00135aee;
              }
              if (bVar2 == 0x5c) {
                __src = __dest + 1;
                bVar2 = __dest[1];
                pbVar19 = __src;
                if (bVar2 != 0x5c) {
                  if (bVar2 == 0) goto LAB_0013600c;
                  pbVar19 = __dest;
                  if (bVar2 == 10) goto LAB_0013603a;
                }
              }
LAB_00135fff:
              __dest = pbVar19 + 1;
            } while( true );
          }
          pcVar17 = "Can\'t allocate working buffer";
          iVar4 = 0xc;
        }
        else {
          pcVar17 = "Line too long";
          iVar4 = 0x54;
        }
        goto LAB_001366fb;
      }
      goto LAB_00136702;
    }
LAB_00136543:
    mtree->this_entry = mtree->entries;
    free_options((mtree_option *)local_100);
  }
LAB_00135aee:
  (a->archive).archive_format = mtree->archive_format;
  (a->archive).archive_format_name = mtree->archive_format_name;
  pmVar18 = mtree->this_entry;
  pcVar17 = (char *)0x1;
  if (pmVar18 != (mtree_entry *)0x0) {
    paVar9 = &mtree->current_dir;
    entry_00 = local_e0;
    do {
      pcVar17 = pmVar18->name;
      if (((*pcVar17 == '.') && (pcVar17[1] == '.')) && (pcVar17[2] == '\0')) {
        pmVar18->used = '\x01';
        sVar15 = (mtree->current_dir).length;
        if (sVar15 != 0) {
          pcVar17 = paVar9->s;
          pcVar14 = pcVar17 + sVar15;
          do {
            pcVar27 = pcVar14;
            pcVar14 = pcVar27 + -1;
            if (pcVar14 < pcVar17) break;
          } while (*pcVar14 != '/');
          pcVar27 = pcVar27 + -2;
          if (pcVar14 < pcVar17) {
            pcVar27 = pcVar14;
          }
          (mtree->current_dir).length = (size_t)(pcVar27 + (1 - (long)pcVar17));
        }
      }
      else if (pmVar18->used == '\0') {
        pmVar18->used = '\x01';
        local_100 = entry_00;
        archive_entry_set_filetype(entry_00,0x8000);
        archive_entry_set_size(entry_00,0);
        (mtree->contents_name).length = 0;
        local_f4 = 0;
        uVar3 = parse_line(a,entry_00,mtree,pmVar18,(int *)&local_f4);
        if (pmVar18->full == '\0') {
          sVar15 = (mtree->current_dir).length;
          if (sVar15 != 0) {
            archive_strcat(paVar9,"/");
          }
          archive_strcat(paVar9,pmVar18->name);
          archive_entry_copy_pathname(entry_00,paVar9->s);
          mVar6 = archive_entry_filetype(entry_00);
          if (mVar6 != 0x4000) {
            (mtree->current_dir).length = sVar15;
          }
        }
        else {
          archive_entry_copy_pathname(entry_00,pmVar18->name);
          for (pmVar24 = pmVar18->next; pmVar24 != (mtree_entry *)0x0; pmVar24 = pmVar24->next) {
            if (((pmVar24->full != '\0') && (pmVar24->used == '\0')) &&
               (iVar4 = strcmp(pmVar18->name,pmVar24->name), iVar4 == 0)) {
              pmVar24->used = '\x01';
              uVar5 = parse_line(a,local_e0,mtree,pmVar24,(int *)&local_f4);
              if ((int)uVar5 < (int)uVar3) {
                uVar3 = uVar5;
              }
            }
          }
        }
        entry_00 = local_e0;
        if (mtree->checkfs == '\0') {
LAB_00136689:
          iVar12 = archive_entry_size(entry_00);
          mtree->cur_size = iVar12;
          mtree->offset = 0;
        }
        else {
          mtree->fd = -1;
          if ((mtree->contents_name).length == 0) {
            pcVar17 = archive_entry_pathname(local_e0);
          }
          else {
            pcVar17 = (mtree->contents_name).s;
          }
          mVar6 = archive_entry_filetype(entry_00);
          if ((mVar6 == 0x8000) || (mVar6 = archive_entry_filetype(entry_00), mVar6 == 0x4000)) {
            iVar4 = open(pcVar17,0x80000);
            mtree->fd = iVar4;
            __archive_ensure_cloexec_flag(iVar4);
            iVar4 = mtree->fd;
            if (iVar4 == -1) {
              piVar7 = __errno_location();
              if ((*piVar7 != 2) || ((mtree->contents_name).length != 0)) {
                archive_set_error(&a->archive,*piVar7,"Can\'t open %s",pcVar17);
                uVar3 = 0xffffffec;
              }
              goto LAB_00135cdd;
            }
          }
          else {
LAB_00135cdd:
            iVar4 = mtree->fd;
          }
          if (iVar4 < 0) {
            iVar4 = lstat(pcVar17,&local_c0);
            if (iVar4 != -1) goto LAB_00135d37;
LAB_00135d6c:
            if ((local_f4 & 0x800) == 0) goto LAB_00136689;
LAB_00135e88:
            pmVar18 = mtree->this_entry;
            goto LAB_00135e91;
          }
          iVar4 = fstat(iVar4,&local_c0);
          if (iVar4 == -1) {
            piVar7 = __errno_location();
            archive_set_error(&a->archive,*piVar7,"Could not fstat %s",pcVar17);
            close(mtree->fd);
            mtree->fd = -1;
            uVar3 = 0xffffffec;
            goto LAB_00135d6c;
          }
LAB_00135d37:
          p = local_c0.st_mode;
          uVar5 = local_c0.st_mode & 0xf000;
          if (uVar5 == 0xa000) {
            mVar6 = archive_entry_filetype(entry_00);
            if (mVar6 != 0xa000) goto LAB_00135dd6;
LAB_0013655f:
            uVar5 = local_f4;
            if (((local_f4 & 0x1001) != 1) &&
               ((mVar6 = archive_entry_filetype(entry_00), mVar6 == 0x2000 ||
                (mVar6 = archive_entry_filetype(entry_00), mVar6 == 0x6000)))) {
              archive_entry_set_rdev(entry_00,local_c0.st_rdev);
            }
            if ((uVar5 & 0xc) == 0 || (uVar5 >> 0xc & 1) != 0) {
              archive_entry_set_gid(entry_00,(ulong)local_c0.st_gid);
            }
            if ((uVar5 & 0x600) == 0 || (uVar5 >> 0xc & 1) != 0) {
              archive_entry_set_uid(entry_00,(ulong)local_c0.st_uid);
            }
            if ((uVar5 & 0x1010) != 0x10) {
              archive_entry_set_mtime(entry_00,local_c0.st_mtim.tv_sec,local_c0.st_mtim.tv_nsec);
            }
            if ((uVar5 & 0x1020) != 0x20) {
              archive_entry_set_nlink(entry_00,(uint)local_c0.st_nlink);
            }
            if ((uVar5 & 0x1040) != 0x40) {
              archive_entry_set_perm(entry_00,p);
            }
            if ((uVar5 & 0x1080) != 0x80) {
              archive_entry_set_size(entry_00,local_c0.st_size);
            }
            archive_entry_set_ino(entry_00,local_c0.st_ino);
            archive_entry_set_dev(entry_00,local_c0.st_dev);
            archive_entry_linkify(mtree->resolver,&local_100,&local_d0);
            entry_00 = local_100;
            goto LAB_00136689;
          }
          if ((uVar5 == 0x8000) && (mVar6 = archive_entry_filetype(entry_00), mVar6 == 0x8000))
          goto LAB_0013655f;
LAB_00135dd6:
          if (((~p & 0xc000) == 0) && (mVar6 = archive_entry_filetype(entry_00), mVar6 == 0xc000))
          goto LAB_0013655f;
          switch(uVar5 - 0x1000 >> 0xc) {
          case 0:
            mVar6 = archive_entry_filetype(entry_00);
            if (mVar6 == 0x1000) goto LAB_0013655f;
            break;
          case 1:
            mVar6 = archive_entry_filetype(entry_00);
            if (mVar6 == 0x2000) goto LAB_0013655f;
            break;
          case 3:
            mVar6 = archive_entry_filetype(entry_00);
            if (mVar6 == 0x4000) goto LAB_0013655f;
            break;
          case 5:
            mVar6 = archive_entry_filetype(entry_00);
            if (mVar6 == 0x6000) goto LAB_0013655f;
          }
          if (-1 < mtree->fd) {
            close(mtree->fd);
          }
          mtree->fd = -1;
          if ((local_f4 & 0x800) != 0) goto LAB_00135e88;
          if (uVar3 == 0) {
            pcVar17 = archive_entry_pathname(entry_00);
            archive_set_error(&a->archive,-1,"mtree specification has different type for %s",pcVar17
                             );
            uVar3 = 0xffffffec;
          }
        }
        pcVar17 = (char *)(ulong)uVar3;
        break;
      }
LAB_00135e91:
      pcVar17 = (char *)0x1;
      pmVar18 = pmVar18->next;
      mtree->this_entry = pmVar18;
    } while (pmVar18 != (mtree_entry *)0x0);
  }
LAB_00136711:
  return (int)pcVar17;
LAB_00136081:
  uVar10 = (ulong)(byte)pcVar27[lVar23];
  if (0x2f < uVar10) goto LAB_0013621a;
  if ((0x100000200U >> (uVar10 & 0x3f) & 1) == 0) {
    if ((0x800002401U >> (uVar10 & 0x3f) & 1) != 0) goto LAB_001360bc;
    if (uVar10 == 0x2f) {
      iVar4 = strncmp(pcVar27 + lVar23,"/set",4);
      if (iVar4 == 0) {
        if ((pcVar27[lVar23 + 4] == ' ') || (pcVar27[lVar23 + 4] == '\t')) {
          pcVar27 = pcVar27 + lVar23 + 4;
          goto LAB_00136307;
        }
      }
      else {
        iVar4 = strncmp(pcVar27 + lVar23,"/unset",6);
        if ((iVar4 == 0) && ((pcVar27[lVar23 + 6] == ' ' || (pcVar27[lVar23 + 6] == '\t')))) {
          pcVar17 = strchr(pcVar27 + lVar23 + 6,0x3d);
          if (pcVar17 != (char *)0x0) {
            pcVar17 = "/unset shall not contain `=\'";
            iVar4 = -1;
            goto LAB_001366fb;
          }
          sVar11 = strspn(pcVar27 + lVar23 + 6," \t\r\n");
          cVar16 = pcVar27[lVar23 + 6 + sVar11];
          if (cVar16 == '\0') goto LAB_001360bc;
          pcVar27 = pcVar27 + lVar23 + sVar11 + 6;
          goto LAB_00136198;
        }
      }
      archive_set_error(&a->archive,0x54,"Can\'t parse line %ju",local_108);
      goto LAB_00136702;
    }
    goto LAB_0013621a;
  }
  lVar23 = lVar23 + 1;
  lVar25 = lVar25 + 1;
  pcVar17 = pcVar17 + -1;
  goto LAB_00136081;
LAB_00136307:
  sVar11 = strspn(pcVar27," \t\r\n");
  if (pcVar27[sVar11] == '\0') goto LAB_001360bc;
  pcVar14 = pcVar27 + sVar11;
  sVar11 = strcspn(pcVar14," \t\r\n");
  pcVar27 = pcVar14 + sVar11;
  pcVar17 = strchr(pcVar14,0x3d);
  sVar15 = (long)pcVar17 - (long)pcVar14;
  if (pcVar27 < pcVar17) {
    sVar15 = sVar11;
  }
  remove_option((mtree_option **)&local_100,pcVar14,sVar15);
  uVar3 = add_option(a,(mtree_option **)&local_100,pcVar14,sVar11);
  if (uVar3 != 0) goto LAB_001366d3;
  goto LAB_00136307;
LAB_00136198:
  do {
    sVar11 = strcspn(pcVar27," \t\r\n");
    sVar15 = sVar11;
    if (sVar11 == 3) {
      if (((cVar16 != 'a') || (pcVar27[1] != 'l')) || (pcVar27[2] != 'l')) {
        sVar15 = 3;
        goto LAB_001361ef;
      }
      free_options((mtree_option *)local_100);
      local_100 = (archive_entry *)0x0;
    }
    else {
LAB_001361ef:
      remove_option((mtree_option **)&local_100,pcVar27,sVar15);
    }
    pcVar27 = pcVar27 + sVar11;
    sVar11 = strspn(pcVar27," \t\r\n");
    cVar16 = pcVar27[sVar11];
    pcVar27 = pcVar27 + sVar11;
  } while (cVar16 != '\0');
LAB_001360bc:
  local_108 = local_108 + 1;
  __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
  if (__s == (void *)0x0) goto LAB_00136543;
  goto LAB_00135f2b;
LAB_0013621a:
  local_e8 = (mtree_entry *)local_c0.st_dev;
  local_d8 = (mtree_entry *)CONCAT44(local_d8._4_4_,(uint32_t)local_d0);
  pmVar18 = (mtree_entry *)malloc(0x20);
  if (pmVar18 != (mtree_entry *)0x0) {
    pmVar24 = (mtree_entry *)(pcVar27 + lVar23);
    pcVar22 = pcVar14 + (long)&local_e8->next;
    lVar20 = (long)pcVar22 - lVar23;
    *(undefined8 *)((long)&pmVar18->options + 2) = 0;
    *(undefined8 *)((long)&pmVar18->name + 2) = 0;
    pmVar18->next = (mtree_entry *)0x0;
    pmVar18->options = (mtree_option *)0x0;
    pmVar13 = local_f0;
    if (local_f0 == (mtree_entry *)0x0) {
      pmVar13 = local_c8;
    }
    pmVar13->next = pmVar18;
    if ((int)local_d8 == 0) {
      local_e8 = pmVar24;
      sVar11 = strcspn((char *)pmVar24," \t\r\n");
      pmVar24 = (mtree_entry *)(pcVar27 + lVar23 + sVar11);
      pmVar13 = local_e8;
      local_f0 = (mtree_entry *)(lVar20 + (long)pmVar24);
    }
    else {
      if (lVar20 < 1) {
        pcVar1 = (char *)((long)pmVar24 + lVar20);
      }
      else {
        pmVar21 = (mtree_entry *)(lVar20 + (long)pmVar24);
        pcVar1 = pcVar27 + lVar23;
        pcVar14 = pcVar14 + (long)pcVar27;
        do {
          pcVar14 = pcVar14 + -1;
          uVar10 = (ulong)(byte)pcVar14[(long)local_e8];
          if ((0x20 < uVar10) || ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0)) {
            pmVar13 = (mtree_entry *)(pcVar14 + (lVar23 - (long)pcVar22) + (long)local_e8);
            sVar11 = (long)local_e8 - lVar25;
            lVar23 = 1;
            goto LAB_001364ee;
          }
          lVar25 = lVar25 + 1;
          pcVar22 = pcVar22 + -1;
          pcVar27 = pcVar17 + -1;
          pcVar17 = pcVar17 + -1;
          pmVar21 = (mtree_entry *)&pmVar21[-1].field_0x1f;
        } while (1 < (long)(pcVar27 + (long)&local_e8->next));
      }
      sVar11 = 0;
      pmVar13 = (mtree_entry *)(pcVar1 + -1);
      local_f0 = (mtree_entry *)(pcVar1 + -1);
    }
LAB_001363be:
    pcVar17 = (char *)malloc(sVar11 + 1);
    pmVar18->name = pcVar17;
    if (pcVar17 != (char *)0x0) {
      memcpy(pcVar17,pmVar13,sVar11);
      pcVar17[sVar11] = '\0';
      local_d8 = pmVar18;
      parse_escapes(pcVar17,pmVar18);
      puVar26 = (undefined1 *)&local_100;
      while (puVar26 = *(undefined1 **)puVar26, pmVar13 = (mtree_entry *)&pmVar18->options,
            puVar26 != (undefined1 *)0x0) {
        pcVar17 = *(char **)((long)puVar26 + 8);
        sVar11 = strlen(pcVar17);
        uVar3 = add_option(a,&pmVar18->options,pcVar17,sVar11);
        if (uVar3 != 0) goto LAB_001366d3;
      }
      while ((local_e8 = pmVar13, sVar11 = strspn((char *)pmVar24," \t\r\n"),
             *(char *)((long)&pmVar24->next + sVar11) != '\0' &&
             (pmVar18 = (mtree_entry *)((long)&pmVar24->next + sVar11), pmVar18 < local_f0))) {
        len = strcspn((char *)pmVar18," \t\r\n");
        pmVar24 = (mtree_entry *)((long)&pmVar18->next + len);
        pmVar21 = (mtree_entry *)strchr((char *)pmVar18,0x3d);
        pmVar13 = local_e8;
        sVar11 = (long)pmVar21 - (long)pmVar18;
        if (pmVar24 < pmVar21) {
          sVar11 = len;
        }
        if (pmVar21 == (mtree_entry *)0x0) {
          sVar11 = len;
        }
        remove_option((mtree_option **)local_e8,(char *)pmVar18,sVar11);
        uVar3 = add_option(a,(mtree_option **)pmVar13,(char *)pmVar18,len);
        pmVar13 = local_e8;
        if (uVar3 != 0) goto LAB_001366d3;
      }
      local_f0 = local_d8;
      goto LAB_001360bc;
    }
  }
  piVar7 = __errno_location();
  iVar4 = *piVar7;
  pcVar17 = "Can\'t allocate memory";
LAB_001366fb:
  archive_set_error(&a->archive,iVar4,pcVar17);
LAB_00136702:
  pcVar17 = (char *)0xffffffe2;
  goto LAB_00136707;
LAB_001364ee:
  if (((byte)uVar10 < 0x21) && ((0x100002600U >> (uVar10 & 0x3f) & 1) != 0)) {
    sVar11 = lVar23 - 1;
    pmVar13 = pmVar21;
    local_f0 = pmVar21;
    goto LAB_001363be;
  }
  local_f0 = pmVar13;
  if ((lVar25 - (long)local_e8) + lVar23 == 0) goto LAB_001363be;
  uVar10 = (ulong)(byte)pmVar21[-1].field_0x1e;
  lVar23 = lVar23 + 1;
  pmVar21 = (mtree_entry *)&pmVar21[-1].field_0x1f;
  goto LAB_001364ee;
LAB_001366d3:
  pcVar17 = (char *)(ulong)uVar3;
LAB_00136707:
  free_options((mtree_option *)local_100);
  goto LAB_00136711;
LAB_0013603a:
  memmove(__dest,__src,(size_t)(pcVar27 + (long)(pcVar17 + (1 - (long)__dest))));
  pcVar17 = pcVar17 + -1;
  pcVar27 = (mtree->line).s;
  __dest = __src;
LAB_0013600c:
  lVar23 = (long)__dest - (long)pcVar27;
  __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
  pcVar14 = pcVar17;
  if (__s == (void *)0x0) goto LAB_00136543;
  goto LAB_00135f31;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry)
{
	struct mtree *mtree;
	char *p;
	int r, use_next;

	mtree = (struct mtree *)(a->format->data);

	if (mtree->fd >= 0) {
		close(mtree->fd);
		mtree->fd = -1;
	}

	if (mtree->entries == NULL) {
		mtree->resolver = archive_entry_linkresolver_new();
		if (mtree->resolver == NULL)
			return ARCHIVE_FATAL;
		archive_entry_linkresolver_set_strategy(mtree->resolver,
		    ARCHIVE_FORMAT_MTREE);
		r = read_mtree(a, mtree);
		if (r != ARCHIVE_OK)
			return (r);
	}

	a->archive.archive_format = mtree->archive_format;
	a->archive.archive_format_name = mtree->archive_format_name;

	for (;;) {
		if (mtree->this_entry == NULL)
			return (ARCHIVE_EOF);
		if (strcmp(mtree->this_entry->name, "..") == 0) {
			mtree->this_entry->used = 1;
			if (archive_strlen(&mtree->current_dir) > 0) {
				/* Roll back current path. */
				p = mtree->current_dir.s
				    + mtree->current_dir.length - 1;
				while (p >= mtree->current_dir.s && *p != '/')
					--p;
				if (p >= mtree->current_dir.s)
					--p;
				mtree->current_dir.length
				    = p - mtree->current_dir.s + 1;
			}
		}
		if (!mtree->this_entry->used) {
			use_next = 0;
			r = parse_file(a, entry, mtree, mtree->this_entry, &use_next);
			if (use_next == 0)
				return (r);
		}
		mtree->this_entry = mtree->this_entry->next;
	}
}